

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

int lws_write(lws *wsi,uchar *buf,size_t len,lws_write_protocol wp)

{
  _func_int_lws_ptr_uchar_ptr_size_t_lws_write_protocol_ptr *p_Var1;
  undefined4 in_EAX;
  int iVar2;
  undefined8 in_R9;
  undefined8 uStack_8;
  lws_write_protocol wp_local;
  
  uStack_8 = CONCAT44(wp,in_EAX);
  if ((int)len < 0) {
    _lws_log(1,"%s: suspicious len int %d, ulong %lu\n","lws_write",len & 0xffffffff,len,in_R9,
             uStack_8);
    iVar2 = -1;
  }
  else {
    if (wsi->role_ops == (lws_role_ops *)0x0) {
      __assert_fail("wsi->role_ops",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/output.c"
                    ,0xfd,
                    "int lws_write(struct lws *, unsigned char *, size_t, enum lws_write_protocol)")
      ;
    }
    p_Var1 = wsi->role_ops->write_role_protocol;
    if (p_Var1 == (_func_int_lws_ptr_uchar_ptr_size_t_lws_write_protocol_ptr *)0x0) {
      iVar2 = lws_issue_raw(wsi,buf,len);
      return iVar2;
    }
    iVar2 = (*p_Var1)(wsi,buf,len,&wp_local);
  }
  return iVar2;
}

Assistant:

int
lws_write(struct lws *wsi, unsigned char *buf, size_t len,
	  enum lws_write_protocol wp)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
#if defined(LWS_WITH_DETAILED_LATENCY)
	lws_usec_t us;
#endif
	int m;

	lws_stats_bump(pt, LWSSTATS_C_API_LWS_WRITE, 1);

	if ((int)len < 0) {
		lwsl_err("%s: suspicious len int %d, ulong %lu\n", __func__,
				(int)len, (unsigned long)len);
		return -1;
	}

	lws_stats_bump(pt, LWSSTATS_B_WRITE, len);

#ifdef LWS_WITH_ACCESS_LOG
	wsi->http.access_log.sent += len;
#endif
#if defined(LWS_WITH_SERVER_STATUS)
	if (wsi->vhost)
		wsi->vhost->conn_stats.tx += len;
#endif
#if defined(LWS_WITH_DETAILED_LATENCY)
	us = lws_now_usecs();
#endif

	assert(wsi->role_ops);
	if (!wsi->role_ops->write_role_protocol)
		return lws_issue_raw(wsi, buf, len);

	m = wsi->role_ops->write_role_protocol(wsi, buf, len, &wp);
	if (m < 0)
		return m;

#if defined(LWS_WITH_DETAILED_LATENCY)
	if (wsi->context->detailed_latency_cb) {
		wsi->detlat.req_size = len;
		wsi->detlat.acc_size = m;
		wsi->detlat.type = LDLT_WRITE;
		if (wsi->detlat.earliest_write_req_pre_write)
			wsi->detlat.latencies[LAT_DUR_PROXY_PROXY_REQ_TO_WRITE] =
					us - wsi->detlat.earliest_write_req_pre_write;
		else
			wsi->detlat.latencies[LAT_DUR_PROXY_PROXY_REQ_TO_WRITE] = 0;
		wsi->detlat.latencies[LAT_DUR_USERCB] = lws_now_usecs() - us;
		lws_det_lat_cb(wsi->context, &wsi->detlat);

	}
#endif

	return m;
}